

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::Version::GetOverlappingInputs
          (Version *this,int level,InternalKey *begin,InternalKey *end,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs)

{
  pointer *pppFVar1;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *p_Var2;
  Comparator *pCVar3;
  iterator __position;
  int iVar4;
  pointer ppFVar5;
  ulong uVar6;
  FileMetaData *f;
  Slice file_limit;
  Slice file_start;
  FileMetaData *local_88;
  int local_7c;
  Slice local_78;
  Slice local_68;
  Slice local_50;
  Slice local_40;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x1f5,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  if (6 < level) {
    __assert_fail("level < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x1f6,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  ppFVar5 = (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppFVar5;
  }
  local_68 = (Slice)ZEXT816(0x160e35);
  local_78 = (Slice)ZEXT816(0x160e35);
  if (begin != (InternalKey *)0x0) {
    local_68 = InternalKey::user_key(begin);
  }
  if (end != (InternalKey *)0x0) {
    local_78 = InternalKey::user_key(end);
  }
  ppFVar5 = this->files_[(uint)level].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->files_[(uint)level].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar5) {
    pCVar3 = (this->vset_->icmp_).user_comparator_;
    p_Var2 = &this->files_[(uint)level].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>;
    uVar6 = 0;
    local_7c = level;
    do {
      local_88 = ppFVar5[uVar6];
      uVar6 = uVar6 + 1;
      local_40 = InternalKey::user_key(&local_88->smallest);
      local_50 = InternalKey::user_key(&local_88->largest);
      if (begin == (InternalKey *)0x0) {
LAB_0011ed76:
        if (end != (InternalKey *)0x0) {
          iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_40,&local_78);
          if (0 < iVar4) goto LAB_0011ee20;
        }
        __position._M_current =
             (inputs->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
          _M_realloc_insert<leveldb::FileMetaData*const&>
                    ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)inputs
                     ,__position,&local_88);
        }
        else {
          *__position._M_current = local_88;
          pppFVar1 = &(inputs->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        if (local_7c == 0) {
          if (begin == (InternalKey *)0x0) {
LAB_0011edde:
            if (end != (InternalKey *)0x0) {
              iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_50,&local_78);
              if (0 < iVar4) {
                local_78 = local_50;
                goto LAB_0011ee11;
              }
            }
          }
          else {
            iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_40,&local_68);
            if (-1 < iVar4) goto LAB_0011edde;
            local_68 = local_40;
LAB_0011ee11:
            ppFVar5 = (inputs->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((inputs->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
              (inputs->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_finish = ppFVar5;
            }
            uVar6 = 0;
          }
        }
      }
      else {
        iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_50,&local_68);
        if (-1 < iVar4) goto LAB_0011ed76;
      }
LAB_0011ee20:
      ppFVar5 = (p_Var2->_M_impl).super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(p_Var2->_M_impl).super__Vector_impl_data._M_finish -
                             (long)ppFVar5 >> 3));
  }
  return;
}

Assistant:

void Version::GetOverlappingInputs(int level, const InternalKey* begin,
                                   const InternalKey* end,
                                   std::vector<FileMetaData*>* inputs) {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  inputs->clear();
  Slice user_begin, user_end;
  if (begin != nullptr) {
    user_begin = begin->user_key();
  }
  if (end != nullptr) {
    user_end = end->user_key();
  }
  const Comparator* user_cmp = vset_->icmp_.user_comparator();
  for (size_t i = 0; i < files_[level].size();) {
    FileMetaData* f = files_[level][i++];
    const Slice file_start = f->smallest.user_key();
    const Slice file_limit = f->largest.user_key();
    if (begin != nullptr && user_cmp->Compare(file_limit, user_begin) < 0) {
      // "f" is completely before specified range; skip it
    } else if (end != nullptr && user_cmp->Compare(file_start, user_end) > 0) {
      // "f" is completely after specified range; skip it
    } else {
      inputs->push_back(f);
      if (level == 0) {
        // Level-0 files may overlap each other.  So check if the newly
        // added file has expanded the range.  If so, restart search.
        if (begin != nullptr && user_cmp->Compare(file_start, user_begin) < 0) {
          user_begin = file_start;
          inputs->clear();
          i = 0;
        } else if (end != nullptr &&
                   user_cmp->Compare(file_limit, user_end) > 0) {
          user_end = file_limit;
          inputs->clear();
          i = 0;
        }
      }
    }
  }
}